

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

TestSuite * __thiscall
testing::internal::UnitTestImpl::GetTestSuite
          (UnitTestImpl *this,char *test_suite_name,char *type_param,SetUpTestSuiteFunc set_up_tc,
          TearDownTestSuiteFunc tear_down_tc)

{
  bool bVar1;
  byte bVar2;
  reference ppTVar3;
  TestSuite *pTVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  allocator<char> *paVar5;
  allocator<char> *in_RDI;
  TestSuite *new_test_suite;
  reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>_>
  test_suite;
  string *in_stack_fffffffffffffea8;
  TestSuiteNameIs *in_stack_fffffffffffffeb0;
  vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffec0;
  char *filter;
  TestSuite *name_str;
  TearDownTestSuiteFunc in_stack_ffffffffffffff20;
  TestSuiteNameIs *in_stack_ffffffffffffff28;
  reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>_>
  *in_stack_ffffffffffffff30;
  reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>_>
  *in_stack_ffffffffffffff38;
  TestSuite *in_stack_ffffffffffffff40;
  const_iterator in_stack_ffffffffffffff48;
  allocator<char> local_89;
  string local_88 [112];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  TestSuite *local_8;
  
  paVar5 = in_RDI + 0xb8;
  local_18 = in_RSI;
  std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::rbegin
            (in_stack_fffffffffffffeb8);
  std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::rend
            (in_stack_fffffffffffffeb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_18,(char *)paVar5,in_RDI);
  TestSuiteNameIs::TestSuiteNameIs(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  std::
  find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite**,std::vector<testing::TestSuite*,std::allocator<testing::TestSuite*>>>>,testing::internal::TestSuiteNameIs>
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  TestSuiteNameIs::~TestSuiteNameIs((TestSuiteNameIs *)0x13848a);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::rend
            (in_stack_fffffffffffffeb8);
  bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>_>
                           *)in_stack_fffffffffffffeb0,
                          (reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>_>
                           *)in_stack_fffffffffffffea8);
  if (bVar1) {
    ppTVar3 = std::
              reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>_>
              ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>_>
                           *)in_stack_fffffffffffffeb0);
    local_8 = *ppTVar3;
  }
  else {
    pTVar4 = (TestSuite *)operator_new(0x108);
    TestSuite::TestSuite
              (in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38,
               (char *)in_stack_ffffffffffffff30,(SetUpTestSuiteFunc)in_stack_ffffffffffffff28,
               in_stack_ffffffffffffff20);
    filter = &stack0xffffffffffffff2f;
    name_str = pTVar4;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_18,(char *)paVar5,in_RDI);
    bVar2 = UnitTestOptions::MatchesFilter((string *)name_str,filter);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff2f);
    if ((bVar2 & 1) == 0) {
      std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::push_back
                ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)
                 CONCAT17(bVar2,in_stack_fffffffffffffec0),(value_type *)in_stack_fffffffffffffeb8);
    }
    else {
      *(int *)(in_RDI + 0x164) = *(int *)(in_RDI + 0x164) + 1;
      paVar5 = in_RDI + 0xb8;
      std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::begin
                ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)
                 in_stack_fffffffffffffea8);
      __gnu_cxx::
      __normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
      ::operator+((__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
                   *)paVar5,(difference_type)in_stack_fffffffffffffeb0);
      __gnu_cxx::
      __normal_iterator<testing::TestSuite*const*,std::vector<testing::TestSuite*,std::allocator<testing::TestSuite*>>>
      ::__normal_iterator<testing::TestSuite**>
                ((__normal_iterator<testing::TestSuite_*const_*,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
                  *)in_stack_fffffffffffffeb0,
                 (__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
                  *)in_stack_fffffffffffffea8);
      std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::insert
                ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)
                 in_stack_ffffffffffffff40,in_stack_ffffffffffffff48,
                 (value_type *)in_stack_ffffffffffffff38);
    }
    paVar5 = in_RDI + 0xd0;
    std::vector<int,_std::allocator<int>_>::size
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xd0));
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)paVar5,
               (value_type_conflict *)in_stack_fffffffffffffea8);
    local_8 = pTVar4;
  }
  return local_8;
}

Assistant:

TestSuite* UnitTestImpl::GetTestSuite(
    const char* test_suite_name, const char* type_param,
    internal::SetUpTestSuiteFunc set_up_tc,
    internal::TearDownTestSuiteFunc tear_down_tc) {
  // Can we find a TestSuite with the given name?
  const auto test_suite =
      std::find_if(test_suites_.rbegin(), test_suites_.rend(),
                   TestSuiteNameIs(test_suite_name));

  if (test_suite != test_suites_.rend()) return *test_suite;

  // No.  Let's create one.
  auto* const new_test_suite =
      new TestSuite(test_suite_name, type_param, set_up_tc, tear_down_tc);

  // Is this a death test suite?
  if (internal::UnitTestOptions::MatchesFilter(test_suite_name,
                                               kDeathTestSuiteFilter)) {
    // Yes.  Inserts the test suite after the last death test suite
    // defined so far.  This only works when the test suites haven't
    // been shuffled.  Otherwise we may end up running a death test
    // after a non-death test.
    ++last_death_test_suite_;
    test_suites_.insert(test_suites_.begin() + last_death_test_suite_,
                        new_test_suite);
  } else {
    // No.  Appends to the end of the list.
    test_suites_.push_back(new_test_suite);
  }

  test_suite_indices_.push_back(static_cast<int>(test_suite_indices_.size()));
  return new_test_suite;
}